

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O3

void license::initializeProject
               (parsed_options *parsed,variables_map *vm,char **argv,options_description *global)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar3;
  options_description_easy_init *poVar4;
  typed_value<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *ptVar5;
  string templates_folder;
  string project_folder;
  string project_name;
  Project project;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  public_key;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  primary_key;
  options_description project_desc;
  undefined8 local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  Project local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_88 [24];
  void *local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_48 [24];
  
  paVar1 = &local_188.m_name.field_2;
  local_188.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"project init options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_b0,(string *)&local_188,0x50,0x28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_188.m_name._M_dataplus._M_p);
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_local_buf[0] = '\0';
  local_d8.super_type.m_initialized = false;
  local_100.super_type.m_initialized = false;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_1f0 = boost::program_options::options_description::add_options
                        ((options_description *)local_b0);
  ptVar3 = boost::program_options::value<std::__cxx11::string>(&local_1a8);
  ptVar3->m_required = true;
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)&local_1f0,"project-name,n",
                      (value_semantic *)ptVar3,"New project name (required).");
  ptVar5 = boost::program_options::value<boost::optional<std::__cxx11::string>>(&local_d8);
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar4,"primary-key",(value_semantic *)ptVar5,
                      "use externally generated primary key, public key must also be specified.");
  ptVar5 = boost::program_options::value<boost::optional<std::__cxx11::string>>(&local_100);
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar4,"public-key",(value_semantic *)ptVar5,
                      "Use externally generated public key, private key must also be specified.");
  ptVar3 = boost::program_options::value<std::__cxx11::string>(&local_1c8);
  local_188.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,".","");
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar3,&local_188.m_name);
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar4,"projects-folder,p",(value_semantic *)ptVar3,
                      "path to where all the projects configurations are stored.");
  ptVar3 = boost::program_options::value<std::__cxx11::string>(&local_1e8);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,".","");
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar3,&local_120);
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar4,"templates,t",(value_semantic *)ptVar3,"path to the templates folder.")
  ;
  boost::program_options::options_description_easy_init::operator()
            (poVar4,"help","Print this help.");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_188.m_name._M_dataplus._M_p);
  }
  local_188.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"project init","");
  bVar2 = rerunBoostPO(parsed,(options_description *)local_b0,vm,argv,&local_188.m_name,global);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_188.m_name._M_dataplus._M_p);
  }
  if (bVar2) {
    Project::Project(&local_188,&local_1a8,&local_1c8,&local_1e8,false);
    Project::initialize(&local_188);
    Project::~Project(&local_188);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((local_100.super_type.m_initialized == true) &&
     (local_100.super_type.m_storage.dummy_.aligner_ !=
      (type)((long)&local_100.super_type.m_storage.dummy_ + 0x10))) {
    operator_delete((void *)local_100.super_type.m_storage.dummy_.aligner_);
  }
  if ((local_d8.super_type.m_initialized == true) &&
     (local_d8.super_type.m_storage.dummy_.aligner_ !=
      (type)((long)&local_d8.super_type.m_storage.dummy_ + 0x10))) {
    operator_delete((void *)local_d8.super_type.m_storage.dummy_.aligner_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_48);
  if (local_70 != (void *)0x0) {
    operator_delete(local_70);
    local_70 = (void *)0x0;
    local_68 = 0;
    local_60 = 0;
    local_58 = 0;
    local_50 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_88);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  return;
}

Assistant:

static void initializeProject(const po::parsed_options &parsed, po::variables_map &vm, const char **argv,
							  const po::options_description &global) {
	po::options_description project_desc("project init options");
	std::string project_name;
	boost::optional<std::string> primary_key;
	boost::optional<std::string> public_key;
	std::string project_folder;
	std::string templates_folder;
	project_desc.add_options()  //
		("project-name,n", po::value<std::string>(&project_name)->required(), "New project name (required).")  //
		(PARAM_PRIMARY_KEY, po::value<boost::optional<std::string>>(&primary_key),
		 "use externally generated primary key, public key must also be specified.")  //
		("public-key", po::value<boost::optional<std::string>>(&public_key),
		 "Use externally generated public key, private key must also be specified.")  //
		("projects-folder,p", po::value<std::string>(&project_folder)->default_value("."),  //
		 "path to where all the projects configurations are stored.")  //
		("templates,t", po::value<std::string>(&templates_folder)->default_value("."),
		 "path to the templates folder.")  //
		("help", "Print this help.");  //
	if (rerunBoostPO(parsed, project_desc, vm, argv, "project init", global)) {
		// cout << templates_folder.is_initialized() << endl;
		Project project(project_name, project_folder, templates_folder);
		project.initialize();
	}
}